

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  Mat *in_RDI;
  int i;
  Mat *this_00;
  Mat local_50;
  int local_c;
  
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    *(undefined4 *)((long)in_RDI + (long)local_c * 0x48) = 0;
    this_00 = &local_50;
    Mat::Mat(this_00);
    Mat::operator=(in_RDI,this_00);
    Mat::~Mat((Mat *)0x13957f);
  }
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].type = 0;
        params[i].v = Mat();
    }
}